

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_scriptedmarine.cpp
# Opt level: O2

int AF_A_M_Refire(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  AActor *actor;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005259fa;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005259ea;
  actor = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (actor == (AActor *)0x0) goto LAB_00525877;
    bVar2 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005259fa;
    }
  }
  else {
    if (actor != (AActor *)0x0) goto LAB_005259ea;
LAB_00525877:
    actor = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005259ea:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005259fa;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005259fa;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_005259ea;
    }
    if (2 < (uint)numparam) {
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 != 0xff) &&
         ((VVar1 != '\x03' ||
          ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
LAB_005259fa:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                      ,0x9e,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      if (numparam != 3) {
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\0') {
          bVar2 = param[3].field_0.i != 0;
          goto LAB_0052591a;
        }
        if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                        ,0x9f,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
    }
  }
  bVar2 = false;
LAB_0052591a:
  obj = &actor->target;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
  if ((pAVar4 == (AActor *)0x0) ||
     (pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar4->health < 1)) {
    if ((actor->MissileState != (FState *)0x0) &&
       (((iVar3 = FRandom::operator()(&pr_m_refire), iVar3 < 0xa0 &&
         (bVar2 = P_LookForPlayers(actor,1,(FLookExParams *)0x0), bVar2)) &&
        (bVar2 = P_CheckMissileRange(actor), bVar2)))) {
      return 0;
    }
  }
  else if (((!bVar2) && (actor->MissileState != (FState *)0x0)) ||
          (bVar2 = AActor::CheckMeleeRange(actor), bVar2)) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    bVar2 = P_CheckSight(actor,pAVar4,0);
    if ((bVar2) && (iVar3 = FRandom::operator()(&pr_m_refire), 3 < iVar3)) {
      return 0;
    }
  }
  AActor::SetState(actor,actor->state + 1,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_M_Refire)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_BOOL_OPT(ignoremissile)	{ ignoremissile = false; }

	if (self->target == NULL || self->target->health <= 0)
	{
		if (self->MissileState && pr_m_refire() < 160)
		{ // Look for a new target most of the time
			if (P_LookForPlayers (self, true, NULL) && P_CheckMissileRange (self))
			{ // Found somebody new and in range, so don't stop shooting
				return 0;
			}
		}
		self->SetState (self->state + 1);
		return 0;
	}
	if (((ignoremissile || self->MissileState == NULL) && !self->CheckMeleeRange ()) ||
		!P_CheckSight (self, self->target) ||
		pr_m_refire() < 4)	// Small chance of stopping even when target not dead
	{
		self->SetState (self->state + 1);
	}
	return 0;
}